

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

void __thiscall
google::protobuf::EnumDescriptorProto::MergeFrom
          (EnumDescriptorProto *this,EnumDescriptorProto *from)

{
  int *piVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  EnumValueDescriptorProto *from_00;
  void **ppvVar5;
  LogMessage *other;
  EnumValueDescriptorProto *this_00;
  string *psVar6;
  EnumOptions *pEVar7;
  long lVar8;
  LogFinisher local_61;
  LogMessage local_60;
  
  if (from == this) {
    internal::LogMessage::LogMessage
              (&local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/descriptor.pb.cc"
               ,0xcc9);
    other = internal::LogMessage::operator<<(&local_60,"CHECK failed: (&from) != (this): ");
    internal::LogFinisher::operator=(&local_61,other);
    internal::LogMessage::~LogMessage(&local_60);
  }
  internal::RepeatedPtrFieldBase::Reserve
            (&(this->value_).super_RepeatedPtrFieldBase,
             (from->value_).super_RepeatedPtrFieldBase.current_size_ +
             (this->value_).super_RepeatedPtrFieldBase.current_size_);
  if (0 < (from->value_).super_RepeatedPtrFieldBase.current_size_) {
    lVar8 = 0;
    do {
      from_00 = (EnumValueDescriptorProto *)
                (from->value_).super_RepeatedPtrFieldBase.elements_[lVar8];
      iVar3 = (this->value_).super_RepeatedPtrFieldBase.current_size_;
      iVar4 = (this->value_).super_RepeatedPtrFieldBase.allocated_size_;
      if (iVar3 < iVar4) {
        ppvVar5 = (this->value_).super_RepeatedPtrFieldBase.elements_;
        (this->value_).super_RepeatedPtrFieldBase.current_size_ = iVar3 + 1;
        this_00 = (EnumValueDescriptorProto *)ppvVar5[iVar3];
      }
      else {
        iVar3 = (this->value_).super_RepeatedPtrFieldBase.total_size_;
        if (iVar4 == iVar3) {
          internal::RepeatedPtrFieldBase::Reserve
                    (&(this->value_).super_RepeatedPtrFieldBase,iVar3 + 1);
        }
        piVar1 = &(this->value_).super_RepeatedPtrFieldBase.allocated_size_;
        *piVar1 = *piVar1 + 1;
        this_00 = internal::GenericTypeHandler<google::protobuf::EnumValueDescriptorProto>::New();
        ppvVar5 = (this->value_).super_RepeatedPtrFieldBase.elements_;
        iVar3 = (this->value_).super_RepeatedPtrFieldBase.current_size_;
        (this->value_).super_RepeatedPtrFieldBase.current_size_ = iVar3 + 1;
        ppvVar5[iVar3] = this_00;
      }
      EnumValueDescriptorProto::MergeFrom(this_00,from_00);
      lVar8 = lVar8 + 1;
    } while (lVar8 < (from->value_).super_RepeatedPtrFieldBase.current_size_);
  }
  bVar2 = (byte)from->_has_bits_[0];
  if (bVar2 != 0) {
    if ((bVar2 & 1) != 0) {
      this->_has_bits_[0] = this->_has_bits_[0] | 1;
      if (this->name_ == (string *)internal::kEmptyString_abi_cxx11_) {
        psVar6 = (string *)operator_new(0x20);
        (psVar6->_M_dataplus)._M_p = (pointer)&psVar6->field_2;
        psVar6->_M_string_length = 0;
        (psVar6->field_2)._M_local_buf[0] = '\0';
        this->name_ = psVar6;
      }
      std::__cxx11::string::_M_assign((string *)this->name_);
    }
    if ((from->_has_bits_[0] & 4) != 0) {
      *(byte *)this->_has_bits_ = (byte)this->_has_bits_[0] | 4;
      if (this->options_ == (EnumOptions *)0x0) {
        pEVar7 = (EnumOptions *)operator_new(0x68);
        EnumOptions::EnumOptions(pEVar7);
        this->options_ = pEVar7;
      }
      pEVar7 = from->options_;
      if (pEVar7 == (EnumOptions *)0x0) {
        pEVar7 = *(EnumOptions **)(default_instance_ + 0x30);
      }
      EnumOptions::MergeFrom(this->options_,pEVar7);
    }
  }
  UnknownFieldSet::MergeFrom(&this->_unknown_fields_,&from->_unknown_fields_);
  return;
}

Assistant:

void EnumDescriptorProto::MergeFrom(const EnumDescriptorProto& from) {
  GOOGLE_CHECK_NE(&from, this);
  value_.MergeFrom(from.value_);
  if (from._has_bits_[0 / 32] & (0xffu << (0 % 32))) {
    if (from.has_name()) {
      set_name(from.name());
    }
    if (from.has_options()) {
      mutable_options()->::google::protobuf::EnumOptions::MergeFrom(from.options());
    }
  }
  mutable_unknown_fields()->MergeFrom(from.unknown_fields());
}